

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall
cmFileCopier::Parse(cmFileCopier *this,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *args)

{
  cmExecutionStatus *pcVar1;
  uint uVar2;
  size_type sVar3;
  const_reference pvVar4;
  ostream *poVar5;
  ulong uVar6;
  string local_368;
  ostringstream local_348 [8];
  ostringstream e_1;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream e;
  uint local_24;
  uint i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCopier *this_local;
  
  this->Doing = 4;
  local_24 = 1;
  while( true ) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(args);
    if (sVar3 <= local_24) {
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        if (((this->UseGivenPermissionsFile & 1U) == 0) && ((this->UseSourcePermissions & 1U) == 0))
        {
          (*this->_vptr_cmFileCopier[10])();
        }
        if (((this->UseGivenPermissionsDir & 1U) == 0) && ((this->UseSourcePermissions & 1U) == 0))
        {
          (*this->_vptr_cmFileCopier[0xb])();
        }
        this_local._7_1_ = true;
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_348);
        poVar5 = std::operator<<((ostream *)local_348,this->Name);
        std::operator<<(poVar5," given no DESTINATION");
        pcVar1 = this->Status;
        std::__cxx11::ostringstream::str();
        cmExecutionStatus::SetError(pcVar1,&local_368);
        std::__cxx11::string::~string((string *)&local_368);
        this_local._7_1_ = false;
        std::__cxx11::ostringstream::~ostringstream(local_348);
      }
      return this_local._7_1_;
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,(ulong)local_24);
    uVar2 = (*this->_vptr_cmFileCopier[8])(this,pvVar4);
    if ((uVar2 & 1) == 0) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,(ulong)local_24);
      uVar2 = (*this->_vptr_cmFileCopier[9])(this,pvVar4);
      if ((uVar2 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a0);
        poVar5 = std::operator<<((ostream *)local_1a0,"called with unknown argument \"");
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,(ulong)local_24);
        poVar5 = std::operator<<(poVar5,(string *)pvVar4);
        std::operator<<(poVar5,"\".");
        pcVar1 = this->Status;
        std::__cxx11::ostringstream::str();
        cmExecutionStatus::SetError(pcVar1,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::ostringstream::~ostringstream(local_1a0);
        return false;
      }
    }
    if (this->Doing == 1) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool cmFileCopier::Parse(std::vector<std::string> const& args)
{
  this->Doing = DoingFiles;
  for (unsigned int i = 1; i < args.size(); ++i) {
    // Check this argument.
    if (!this->CheckKeyword(args[i]) && !this->CheckValue(args[i])) {
      std::ostringstream e;
      e << "called with unknown argument \"" << args[i] << "\".";
      this->Status.SetError(e.str());
      return false;
    }

    // Quit if an argument is invalid.
    if (this->Doing == DoingError) {
      return false;
    }
  }

  // Require a destination.
  if (this->Destination.empty()) {
    std::ostringstream e;
    e << this->Name << " given no DESTINATION";
    this->Status.SetError(e.str());
    return false;
  }

  // If file permissions were not specified set default permissions.
  if (!this->UseGivenPermissionsFile && !this->UseSourcePermissions) {
    this->DefaultFilePermissions();
  }

  // If directory permissions were not specified set default permissions.
  if (!this->UseGivenPermissionsDir && !this->UseSourcePermissions) {
    this->DefaultDirectoryPermissions();
  }

  return true;
}